

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsview.cpp
# Opt level: O3

void __thiscall QGraphicsView::updateScene(QGraphicsView *this,QList<QRectF> *rects)

{
  byte bVar1;
  qreal qVar2;
  QWidgetData *pQVar3;
  char cVar4;
  int iVar5;
  QRect *pQVar6;
  QRect *pQVar7;
  QWidget *pQVar8;
  uint uVar9;
  uint uVar10;
  long lVar11;
  QRect *dirtyRect;
  qreal *pqVar12;
  QTransform *pQVar13;
  long lVar14;
  QRectF *rect;
  long in_FS_OFFSET;
  bool bVar15;
  bool bVar16;
  byte bVar17;
  undefined1 auVar18 [16];
  QRect QVar19;
  QRegion updateRegion;
  QTransform transform;
  QRectF local_108;
  undefined8 local_e8;
  undefined8 uStack_e0;
  QRect local_d8;
  QRect local_c8;
  QRegion local_b0;
  QList<QRect> local_a8;
  QTransform local_88;
  long local_38;
  
  QVar19._8_8_ = local_c8._8_8_;
  QVar19._0_8_ = local_c8._0_8_;
  bVar17 = 0;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  lVar14 = *(long *)(this + 8);
  if (((*(byte *)(lVar14 + 0x301) & 0x10) == 0) &&
     (local_c8 = QVar19, *(int *)(lVar14 + 0x484) != 3)) {
    local_a8.d.d = (Data *)0x0;
    local_a8.d.ptr = (QRect *)0x0;
    local_a8.d.size = 0;
    iVar5 = QRegion::rectCount();
    QList<QRect>::reserve(&local_a8,(long)iVar5 + (rects->d).size);
    pQVar6 = (QRect *)QRegion::begin();
    pQVar7 = (QRect *)QRegion::end();
    if (pQVar6 != pQVar7) {
      do {
        QtPrivate::QMovableArrayOps<QRect>::emplace<QRect_const&>
                  ((QMovableArrayOps<QRect> *)&local_a8,local_a8.d.size,pQVar6);
        QList<QRect>::end(&local_a8);
        pQVar6 = pQVar6 + 1;
      } while (pQVar6 != pQVar7);
    }
    QRegion::QRegion((QRegion *)&local_88);
    qVar2 = *(qreal *)(lVar14 + 0x528);
    *(qreal *)(lVar14 + 0x528) = local_88.m_matrix[0][0];
    local_88.m_matrix[0][0] = qVar2;
    QRegion::~QRegion((QRegion *)&local_88);
    *(undefined8 *)(lVar14 + 0x530) = 0;
    *(undefined8 *)(lVar14 + 0x538) = 0xffffffffffffffff;
    bVar1 = *(byte *)(lVar14 + 0x300);
    iVar5 = *(int *)(lVar14 + 0x484);
    if (iVar5 == 2) {
      bVar15 = 0x31 < (ulong)((rects->d).size + local_a8.d.size);
    }
    else {
      bVar15 = true;
      if (iVar5 != 4) {
        bVar15 = false;
      }
    }
    local_b0.d = (QRegionData *)&DAT_aaaaaaaaaaaaaaaa;
    QRegion::QRegion(&local_b0);
    local_c8.x1.m_i = 0;
    local_c8.y1.m_i = 0;
    local_c8.x2.m_i = -1;
    local_c8.y2.m_i = -1;
    pQVar8 = QAbstractScrollArea::viewport((QAbstractScrollArea *)this);
    pQVar3 = pQVar8->data;
    local_d8.x2.m_i = (pQVar3->crect).x2.m_i - (pQVar3->crect).x1.m_i;
    local_d8.y2.m_i = (pQVar3->crect).y2.m_i - (pQVar3->crect).y1.m_i;
    local_d8.x1.m_i = 0;
    local_d8.y1.m_i = 0;
    pqVar12 = (qreal *)&DAT_006f5c10;
    pQVar13 = &local_88;
    for (lVar11 = 10; lVar11 != 0; lVar11 = lVar11 + -1) {
      pQVar13->m_matrix[0][0] = *pqVar12;
      pqVar12 = pqVar12 + (ulong)bVar17 * -2 + 1;
      pQVar13 = (QTransform *)((long)pQVar13 + ((ulong)bVar17 * -2 + 1) * 8);
    }
    viewportTransform(&local_88,this);
    lVar11 = (rects->d).size;
    if (lVar11 != 0) {
      lVar11 = lVar11 << 5;
      do {
        local_e8 = &DAT_aaaaaaaaaaaaaaaa;
        uStack_e0 = &DAT_aaaaaaaaaaaaaaaa;
        QTransform::mapRect(&local_108);
        auVar18 = QRectF::toAlignedRect();
        bVar16 = (*(byte *)(lVar14 + 0x488) & 2) == 0;
        uVar9 = (uint)bVar16;
        uVar10 = ~uVar9;
        local_e8._4_4_ = uVar10 + auVar18._4_4_;
        local_e8._0_4_ = uVar10 + auVar18._0_4_;
        uStack_e0._4_4_ = auVar18._12_4_ + uVar9 + 1;
        uStack_e0._0_4_ = (uint)bVar16 + auVar18._8_4_ + 1;
        cVar4 = QRect::intersects(&local_d8);
        if (cVar4 != '\0') {
          QtPrivate::QMovableArrayOps<QRect>::emplace<QRect_const&>
                    ((QMovableArrayOps<QRect> *)&local_a8,local_a8.d.size,(QRect *)&local_e8);
          QList<QRect>::end(&local_a8);
        }
        lVar11 = lVar11 + -0x20;
      } while (lVar11 != 0);
    }
    if (local_a8.d.size != 0) {
      lVar14 = local_a8.d.size << 4;
      pQVar6 = local_a8.d.ptr;
      do {
        if (bVar15) {
          QVar19 = (QRect)QRect::operator|(&local_c8,pQVar6);
          local_c8 = QVar19;
        }
        else {
          QRegion::operator+=(&local_b0,pQVar6);
        }
        if ((bVar1 & 0x40) == 0 || iVar5 == 0) {
          pQVar8 = QAbstractScrollArea::viewport((QAbstractScrollArea *)this);
          QWidget::update(pQVar8);
          goto LAB_0063398a;
        }
        pQVar6 = pQVar6 + 1;
        lVar14 = lVar14 + -0x10;
      } while (lVar14 != 0);
      pQVar8 = QAbstractScrollArea::viewport((QAbstractScrollArea *)this);
      if (bVar15) {
        QWidget::update(pQVar8,&local_c8);
      }
      else {
        QWidget::update(pQVar8,&local_b0);
      }
    }
LAB_0063398a:
    QRegion::~QRegion(&local_b0);
    if (&(local_a8.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_a8.d.d)->super_QArrayData,0x10,0x10);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QGraphicsView::updateScene(const QList<QRectF> &rects)
{
    // ### Note: Since 4.5, this slot is only called if the user explicitly
    // establishes a connection between the scene and the view, as the scene
    // and view are no longer connected. We need to keep it working (basically
    // leave it as it is), but the new delivery path is through
    // QGraphicsScenePrivate::itemUpdate().
    Q_D(QGraphicsView);
    if (d->fullUpdatePending || d->viewportUpdateMode == QGraphicsView::NoViewportUpdate)
        return;

    // Extract and reset dirty scene rect info.
    QList<QRect> dirtyViewportRects;
    dirtyViewportRects.reserve(d->dirtyRegion.rectCount() + rects.size());
    for (const QRect &dirtyRect : d->dirtyRegion)
        dirtyViewportRects += dirtyRect;
    d->dirtyRegion = QRegion();
    d->dirtyBoundingRect = QRect();

    bool fullUpdate = !d->accelerateScrolling || d->viewportUpdateMode == QGraphicsView::FullViewportUpdate;
    bool boundingRectUpdate = (d->viewportUpdateMode == QGraphicsView::BoundingRectViewportUpdate)
                              || (d->viewportUpdateMode == QGraphicsView::SmartViewportUpdate
                                  && ((dirtyViewportRects.size() + rects.size()) >= QGRAPHICSVIEW_REGION_RECT_THRESHOLD));

    QRegion updateRegion;
    QRect boundingRect;
    QRect viewportRect = viewport()->rect();
    bool redraw = false;
    QTransform transform = viewportTransform();

    // Convert scene rects to viewport rects.
    for (const QRectF &rect : rects) {
        QRect xrect = transform.mapRect(rect).toAlignedRect();
        if (!(d->optimizationFlags & DontAdjustForAntialiasing))
            xrect.adjust(-2, -2, 2, 2);
        else
            xrect.adjust(-1, -1, 1, 1);
        if (!viewportRect.intersects(xrect))
            continue;
        dirtyViewportRects << xrect;
    }

    for (const QRect &rect : std::as_const(dirtyViewportRects)) {
        // Add the exposed rect to the update region. In rect update
        // mode, we only count the bounding rect of items.
        if (!boundingRectUpdate) {
            updateRegion += rect;
        } else {
            boundingRect |= rect;
        }
        redraw = true;
        if (fullUpdate) {
            // If fullUpdate is true and we found a visible dirty rect,
            // we're done.
            break;
        }
    }

    if (!redraw)
        return;

    if (fullUpdate)
        viewport()->update();
    else if (boundingRectUpdate)
        viewport()->update(boundingRect);
    else
        viewport()->update(updateRegion);
}